

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

string * anon_unknown.dwarf_15e2a78::TargetId
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *topBuild)

{
  pointer pcVar1;
  long lVar2;
  cmLocalGenerator *this;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  string_view input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string hash;
  cmCryptoHash hasher;
  string path;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  cmCryptoHash local_48;
  string local_38;
  
  cmCryptoHash::cmCryptoHash(&local_48,AlgoSHA3_256);
  this = cmGeneratorTarget::GetLocalGenerator(gt);
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmSystemTools::RelativeIfUnder(&local_38,topBuild,psVar3);
  input._M_str = local_38._M_dataplus._M_p;
  input._M_len = local_38._M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&local_68,&local_48,input);
  std::__cxx11::string::resize((ulong)&local_68,'\x14');
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + psVar3->_M_string_length);
  std::__cxx11::string::append((char *)local_88);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_88,(ulong)local_68._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  cmCryptoHash::~cmCryptoHash(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TargetId(cmGeneratorTarget const* gt, std::string const& topBuild)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string path = RelativeIfUnder(
    topBuild, gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
  std::string hash = hasher.HashString(path);
  hash.resize(20, '0');
  return gt->GetName() + CMAKE_DIRECTORY_ID_SEP + hash;
}